

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

void yang_free_ext_data(yang_ext_substmt *substmt)

{
  char **__ptr;
  char *__ptr_00;
  long lVar1;
  
  if (substmt != (yang_ext_substmt *)0x0) {
    free(substmt->ext_substmt);
    if (substmt->ext_modules != (char **)0x0) {
      __ptr = substmt->ext_modules;
      __ptr_00 = *__ptr;
      if (__ptr_00 != (char *)0x0) {
        lVar1 = 8;
        do {
          free(__ptr_00);
          __ptr = substmt->ext_modules;
          __ptr_00 = *(char **)((long)__ptr + lVar1);
          lVar1 = lVar1 + 8;
        } while (__ptr_00 != (char *)0x0);
      }
      free(__ptr);
    }
    free(substmt);
    return;
  }
  return;
}

Assistant:

void
yang_free_ext_data(struct yang_ext_substmt *substmt)
{
    int i;

    if (!substmt) {
        return;
    }

    free(substmt->ext_substmt);
    if (substmt->ext_modules) {
        for (i = 0; substmt->ext_modules[i]; ++i) {
            free(substmt->ext_modules[i]);
        }
        free(substmt->ext_modules);
    }
    free(substmt);
}